

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

pattern * exprItem(void)

{
  pattern *lhs;
  pattern *rhs;
  
  lhs = setItem();
  while (lookahead == 0x7c) {
    matchTok(0x7c);
    rhs = setItem();
    lhs = makeNode(lhs,rhs,300);
  }
  return lhs;
}

Assistant:

pattern* exprItem() {
   pattern *lhs, *rhs;
   
   lhs = setItem();
   for (;;) {
      if (lookahead == '|') {
	 matchTok('|');
	 rhs = setItem();
	 lhs = makeNode(lhs, rhs, OR_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}